

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemdelegate.cpp
# Opt level: O1

bool __thiscall
QAbstractItemDelegatePrivate::handleEditorEvent
          (QAbstractItemDelegatePrivate *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  QObject *obj;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QWidget *pQVar6;
  QAbstractItemDelegatePrivate *pQVar7;
  long lVar8;
  EndEditHint _t2;
  QEvent *this_00;
  QAbstractItemDelegatePrivate *this_01;
  long in_FS_OFFSET;
  QWidget *editor;
  QWidget *local_60;
  undefined4 local_54;
  QWidget *local_50;
  QMetaMethodArgument local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    local_60 = (QWidget *)0x0;
  }
  else {
    local_60 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
      local_60 = (QWidget *)object;
    }
  }
  obj = *(QObject **)&this->field_0x8;
  if (local_60 != (QWidget *)0x0) {
    uVar1 = *(ushort *)(event + 8);
    bVar3 = false;
    if (uVar1 < 0x12) {
      if (uVar1 == 6) {
        lVar8 = QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
        if ((((lVar8 == 0) &&
             (lVar8 = QMetaObject::cast((QObject *)&QPlainTextEdit::staticMetaObject), lVar8 == 0))
            || (4 < *(int *)(event + 0x40) + 0xfeffffffU)) ||
           ((0x1bU >> (*(int *)(event + 0x40) + 0xfeffffffU & 0x1f) & 1) == 0)) {
          this_00 = event;
          cVar2 = QKeyEvent::matches((StandardKey)event);
          if (cVar2 != '\0') {
            local_48.name = (char *)&local_50;
            local_50 = local_60;
            local_48.data = &local_54;
            local_54 = 4;
            local_48.metaType = (InterfaceType *)0x0;
            QMetaObject::activate(obj,&QAbstractItemDelegate::staticMetaObject,1,&local_48.metaType)
            ;
LAB_00537be2:
            bVar3 = true;
            goto LAB_00537d24;
          }
          iVar5 = *(int *)(event + 0x40);
          if (1 < iVar5 + 0xfefffffcU) {
            if (iVar5 == 0x1000002) {
              bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,local_60);
              bVar3 = true;
              if (!bVar4) goto LAB_00537d24;
              local_48.name = (char *)&local_50;
              local_50 = local_60;
              local_48.metaType = (InterfaceType *)0x0;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_48.metaType);
              _t2 = EditPreviousItem;
            }
            else {
              if (iVar5 != 0x1000001) goto LAB_00537d22;
              bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,local_60);
              bVar3 = true;
              if (!bVar4) goto LAB_00537d24;
              local_48.name = (char *)&local_50;
              local_50 = local_60;
              local_48.metaType = (InterfaceType *)0x0;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_48.metaType);
              _t2 = EditNextItem;
            }
            QAbstractItemDelegate::closeEditor((QAbstractItemDelegate *)obj,local_60,_t2);
            bVar3 = true;
            goto LAB_00537d24;
          }
          bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_00,local_60);
          bVar3 = true;
          if (!bVar4) goto LAB_00537d24;
          local_48.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
          local_48.name = "QWidget*";
          local_48.data = &local_60;
          QMetaObject::invokeMethod<QMetaMethodArgument>
                    (obj,"_q_commitDataAndCloseEditor",QueuedConnection,&local_48);
        }
      }
      else {
        if (uVar1 != 9) goto LAB_00537d24;
LAB_00537c03:
        bVar3 = QWidget::isActiveWindow(local_60);
        if ((!bVar3) || (pQVar6 = QApplication::focusWidget(), pQVar6 != local_60)) {
          for (pQVar6 = QApplication::focusWidget(); pQVar6 != (QWidget *)0x0;
              pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10)) {
            if (pQVar6 == local_60) goto LAB_00537d22;
          }
          this_01 = QGuiApplicationPrivate::platform_integration;
          pQVar7 = (QAbstractItemDelegatePrivate *)
                   (**(code **)(*(long *)QGuiApplicationPrivate::platform_integration + 0x78))();
          if ((pQVar7 == (QAbstractItemDelegatePrivate *)0x0) ||
             (lVar8 = QPlatformDrag::currentDrag(), this_01 = pQVar7, lVar8 == 0)) {
            bVar3 = tryFixup(this_01,local_60);
            if (bVar3) {
              local_48.name = (char *)&local_50;
              local_50 = local_60;
              local_48.metaType = (InterfaceType *)0x0;
              QMetaObject::activate
                        (obj,&QAbstractItemDelegate::staticMetaObject,0,&local_48.metaType);
            }
            if (*(short *)(event + 8) == 9) {
              pQVar6 = *(QWidget **)(*(long *)&local_60->field_0x8 + 0x10);
              bVar3 = QWidget::hasFocus(local_60);
              if (pQVar6 != (QWidget *)0x0 && !bVar3) {
                iVar5 = QFocusEvent::reason();
                QAbstractItemDelegate::closeEditor((QAbstractItemDelegate *)obj,local_60,NoHint);
                bVar3 = false;
                if (iVar5 != 3) goto LAB_00537d24;
                QWidget::setFocus(pQVar6,OtherFocusReason);
                goto LAB_00537d22;
              }
            }
            local_48.name = (char *)&local_50;
            local_50 = local_60;
            local_48.data = &local_54;
            local_54 = 0;
            local_48.metaType = (InterfaceType *)0x0;
            QMetaObject::activate(obj,&QAbstractItemDelegate::staticMetaObject,1,&local_48.metaType)
            ;
          }
        }
      }
    }
    else if (uVar1 == 0x12) {
      if (((local_60->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) goto LAB_00537c03;
    }
    else {
      bVar3 = false;
      if (uVar1 != 0x33) goto LAB_00537d24;
      cVar2 = QKeyEvent::matches((StandardKey)event);
      if (cVar2 != '\0') {
        event[0xc] = (QEvent)0x1;
        goto LAB_00537be2;
      }
    }
  }
LAB_00537d22:
  bVar3 = false;
LAB_00537d24:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QAbstractItemDelegatePrivate::handleEditorEvent(QObject *object, QEvent *event)
{
    Q_Q(QAbstractItemDelegate);

    QWidget *editor = qobject_cast<QWidget*>(object);
    if (!editor)
        return false;
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        if (editorHandlesKeyEvent(editor, keyEvent))
            return false;

#ifndef QT_NO_SHORTCUT
        if (keyEvent->matches(QKeySequence::Cancel)) {
            // don't commit data
            emit q->closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
            return true;
        }
#endif

        switch (keyEvent->key()) {
        case Qt::Key_Tab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditNextItem);
            }
            return true;
        case Qt::Key_Backtab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditPreviousItem);
            }
            return true;
        case Qt::Key_Enter:
        case Qt::Key_Return:
            // We want the editor to be able to process the key press
            // before committing the data (e.g. so it can do
            // validation/fixup of the input).
            if (!tryFixup(editor))
                return true;

            QMetaObject::invokeMethod(q, "_q_commitDataAndCloseEditor",
                                      Qt::QueuedConnection, Q_ARG(QWidget*, editor));
            return false;
        default:
            return false;
        }
    } else if (event->type() == QEvent::FocusOut || (event->type() == QEvent::Hide && editor->isWindow())) {
        //the Hide event will take care of he editors that are in fact complete dialogs
        if (!editor->isActiveWindow() || (QApplication::focusWidget() != editor)) {
            QWidget *w = QApplication::focusWidget();
            while (w) { // don't worry about focus changes internally in the editor
                if (w == editor)
                    return false;
                w = w->parentWidget();
            }
#if QT_CONFIG(draganddrop)
            // The window may lose focus during an drag operation.
            // i.e when dragging involves the taskbar on Windows.
            QPlatformDrag *platformDrag = QGuiApplicationPrivate::instance()->platformIntegration()->drag();
            if (platformDrag && platformDrag->currentDrag()) {
                return false;
            }
#endif
            if (tryFixup(editor))
                emit q->commitData(editor);

            // If the application loses focus while editing, then the focus needs to go back
            // to the itemview when the editor closes. This ensures that when the application
            // is active again it will have the focus on the itemview as expected.
            QWidget *editorParent = editor->parentWidget();
            const bool manuallyFixFocus = (event->type() == QEvent::FocusOut) && !editor->hasFocus() &&
                    editorParent &&
                    (static_cast<QFocusEvent *>(event)->reason() == Qt::ActiveWindowFocusReason);
            emit q->closeEditor(editor, QAbstractItemDelegate::NoHint);
            if (manuallyFixFocus)
                editorParent->setFocus();
        }
#ifndef QT_NO_SHORTCUT
    } else if (event->type() == QEvent::ShortcutOverride) {
        if (static_cast<QKeyEvent*>(event)->matches(QKeySequence::Cancel)) {
            event->accept();
            return true;
        }
#endif
    }
    return false;
}